

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionElimination.cc
# Opt level: O0

bool flow::transform::foldConstantCondBr(IRHandler *handler)

{
  bool bVar1;
  element_type *this;
  TerminateInstr *pTVar2;
  Value *pVVar3;
  BasicBlock *local_f0;
  CondBrInstr *local_e0;
  unique_ptr<flow::BrInstr,_std::default_delete<flow::BrInstr>_> local_c0;
  unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> local_b8;
  undefined1 local_b0 [8];
  unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> x;
  BasicBlock *local_a0;
  pair<flow::BasicBlock_*,_flow::BasicBlock_*> local_98;
  BasicBlock *local_88;
  BasicBlock *local_80;
  pair<flow::BasicBlock_*,_flow::BasicBlock_*> local_78;
  undefined1 local_68 [8];
  pair<flow::BasicBlock_*,_flow::BasicBlock_*> use;
  ConstantBoolean *cond;
  CondBrInstr *condbr;
  BasicBlock *bb;
  iterator __end2;
  iterator __begin2;
  UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
  *__range2;
  IRHandler *handler_local;
  
  ___begin2 = IRHandler::basicBlocks_abi_cxx11_(handler);
  __end2 = util::
           UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
           ::begin((UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
                    *)&__begin2);
  bb = (BasicBlock *)
       util::
       UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
       ::end((UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
              *)&__begin2);
  do {
    bVar1 = util::
            UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
            ::iterator::operator!=(&__end2,(iterator *)&bb);
    if (!bVar1) {
      return false;
    }
    this = util::
           UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
           ::iterator::operator*(&__end2);
    pTVar2 = BasicBlock::getTerminator(this);
    if (pTVar2 == (TerminateInstr *)0x0) {
      local_e0 = (CondBrInstr *)0x0;
    }
    else {
      local_e0 = (CondBrInstr *)
                 __dynamic_cast(pTVar2,&TerminateInstr::typeinfo,&CondBrInstr::typeinfo,0);
    }
    if (local_e0 != (CondBrInstr *)0x0) {
      pVVar3 = CondBrInstr::condition(local_e0);
      if (pVVar3 == (Value *)0x0) {
        local_f0 = (BasicBlock *)0x0;
      }
      else {
        local_f0 = (BasicBlock *)
                   __dynamic_cast(pVVar3,&Value::typeinfo,
                                  &ConstantValue<bool,(flow::LiteralType)1>::typeinfo,0);
      }
      use.second = local_f0;
      if (local_f0 != (BasicBlock *)0x0) {
        std::pair<flow::BasicBlock_*,_flow::BasicBlock_*>::
        pair<flow::BasicBlock_*,_flow::BasicBlock_*,_true>
                  ((pair<flow::BasicBlock_*,_flow::BasicBlock_*> *)local_68);
        bVar1 = ConstantValue<bool,_(flow::LiteralType)1>::get
                          ((ConstantValue<bool,_(flow::LiteralType)1> *)use.second);
        if (bVar1) {
          local_80 = CondBrInstr::trueBlock(local_e0);
          local_88 = CondBrInstr::falseBlock(local_e0);
          local_78 = std::make_pair<flow::BasicBlock*,flow::BasicBlock*>(&local_80,&local_88);
          std::pair<flow::BasicBlock_*,_flow::BasicBlock_*>::operator=
                    ((pair<flow::BasicBlock_*,_flow::BasicBlock_*> *)local_68,&local_78);
        }
        else {
          local_a0 = CondBrInstr::falseBlock(local_e0);
          x._M_t.super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>._M_t.
          super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
          super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl =
               (__uniq_ptr_data<flow::Instr,_std::default_delete<flow::Instr>,_true,_true>)
               CondBrInstr::trueBlock(local_e0);
          local_98 = std::make_pair<flow::BasicBlock*,flow::BasicBlock*>
                               (&local_a0,(BasicBlock **)&x);
          std::pair<flow::BasicBlock_*,_flow::BasicBlock_*>::operator=
                    ((pair<flow::BasicBlock_*,_flow::BasicBlock_*> *)local_68,&local_98);
        }
        BasicBlock::remove((BasicBlock *)local_b0,(char *)this);
        std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::reset
                  ((unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)local_b0,
                   (pointer)0x0);
        std::make_unique<flow::BrInstr,flow::BasicBlock*&>((BasicBlock **)&local_c0);
        std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>::
        unique_ptr<flow::BrInstr,std::default_delete<flow::BrInstr>,void>
                  ((unique_ptr<flow::Instr,std::default_delete<flow::Instr>> *)&local_b8,&local_c0);
        BasicBlock::push_back(this,&local_b8);
        std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::~unique_ptr(&local_b8);
        std::unique_ptr<flow::BrInstr,_std::default_delete<flow::BrInstr>_>::~unique_ptr(&local_c0);
        std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::~unique_ptr
                  ((unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)local_b0);
        return true;
      }
    }
    util::
    UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
    ::iterator::operator++(&__end2);
  } while( true );
}

Assistant:

bool foldConstantCondBr(IRHandler* handler) {
  for (BasicBlock* bb : handler->basicBlocks()) {
    if (auto condbr = dynamic_cast<CondBrInstr*>(bb->getTerminator())) {
      if (auto cond = dynamic_cast<ConstantBoolean*>(condbr->condition())) {
        // FLOW_TRACE("flow: rewrite condbr %{} with constant expression %{}", condbr->name(), cond->name());
        std::pair<BasicBlock*, BasicBlock*> use;

        if (cond->get()) {
          // FLOW_TRACE("if-condition is always true");
          use = std::make_pair(condbr->trueBlock(), condbr->falseBlock());
        } else {
          // FLOW_TRACE("if-condition is always false");
          use = std::make_pair(condbr->falseBlock(), condbr->trueBlock());
        }

        auto x = bb->remove(condbr);
        x.reset(nullptr);
        bb->push_back(std::make_unique<BrInstr>(use.first));
        return true;
      }
    }
  }

  return false;
}